

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::CreateRawPegoutTransaction
          (ElementsTransactionApi *this,uint32_t version,uint32_t locktime,
          vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *txins,
          vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
          *txouts,TxOutPegoutParameters *pegout_data,ConfidentialTxOut *txout_fee,
          Address *pegout_address)

{
  bool bVar1;
  ConfidentialTxOut *in_RDI;
  Address *this_00;
  Amount *value;
  Amount AVar2;
  long in_stack_00000008;
  ConfidentialTxOut *in_stack_00000010;
  Address dummy_addr;
  ConfidentialTxOut empty_fee;
  ConfidentialTransactionController *ctxc;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffff86c;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff87c;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
  *in_stack_fffffffffffff8c8;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
  *in_stack_fffffffffffff8d0;
  undefined8 in_stack_fffffffffffff8d8;
  ElementsTransactionApi *in_stack_fffffffffffff8e0;
  ConfidentialTxOut *txout_fee_00;
  ConfidentialAssetId local_6f0;
  int64_t local_6c8;
  undefined1 local_6c0;
  ConfidentialValue local_6b8;
  int64_t local_690;
  undefined1 local_688;
  int64_t local_588;
  undefined1 local_580;
  ConfidentialValue local_578;
  Amount local_550;
  ByteData local_540;
  allocator local_521;
  string local_520 [32];
  Privkey local_500;
  Pubkey local_4e0 [6];
  Address *in_stack_fffffffffffffbb8;
  BlockHash *in_stack_fffffffffffffbc0;
  pointer in_stack_fffffffffffffbc8;
  pointer in_stack_fffffffffffffbd0;
  pointer in_stack_fffffffffffffbd8;
  NetType in_stack_fffffffffffffbf0;
  pointer in_stack_fffffffffffffbf8;
  pointer in_stack_fffffffffffffc00;
  pointer in_stack_fffffffffffffc08;
  uint32_t in_stack_fffffffffffffc10;
  ByteData *in_stack_fffffffffffffc18;
  NetType in_stack_fffffffffffffc20;
  Address *in_stack_fffffffffffffc28;
  Address local_2d8;
  undefined1 local_141;
  ConfidentialTxOut local_140;
  
  txout_fee_00 = in_RDI;
  core::ConfidentialTxOut::ConfidentialTxOut(&local_140);
  local_141 = 0;
  CreateRawTransaction
            (in_stack_fffffffffffff8e0,(uint32_t)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
             (uint32_t)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8
             ,txout_fee_00);
  bVar1 = core::Pubkey::IsValid((Pubkey *)(in_stack_00000008 + 0x1e0));
  if ((!bVar1) || (bVar1 = core::Privkey::IsInvalid((Privkey *)(in_stack_00000008 + 0x1f8)), bVar1))
  {
    core::Pubkey::Pubkey(local_4e0);
    core::Privkey::Privkey(&local_500);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_520,"",&local_521);
    core::ByteData::ByteData(&local_540);
    value = (Amount *)&local_540;
    this_00 = (Address *)local_4e0;
    uVar4 = 3;
    uVar3 = 0;
    ConfidentialTransactionController::AddPegoutTxOut
              ((ConfidentialTransactionController *)in_stack_fffffffffffffbd8,
               (Amount *)in_stack_fffffffffffffbd0,(ConfidentialAssetId *)in_stack_fffffffffffffbc8,
               in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbf0,
               (Pubkey *)in_stack_fffffffffffffbf8,(Privkey *)in_stack_fffffffffffffc00,
               (string *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc18,in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference
              ((ConfidentialTxOutReference *)this_00);
    core::ByteData::~ByteData((ByteData *)0x5907ca);
    std::__cxx11::string::~string(local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    core::Privkey::~Privkey((Privkey *)0x5907f1);
    core::Pubkey::~Pubkey((Pubkey *)0x5907fe);
  }
  else {
    core::Address::Address(&local_2d8);
    this_00 = (Address *)(in_stack_00000008 + 0x1e0);
    uVar3 = *(undefined4 *)(in_stack_00000008 + 0x238);
    value = (Amount *)(in_stack_00000008 + 0x240);
    uVar4 = *(undefined4 *)(in_stack_00000008 + 600);
    ConfidentialTransactionController::AddPegoutTxOut
              ((ConfidentialTransactionController *)in_stack_fffffffffffffbd8,
               (Amount *)in_stack_fffffffffffffbd0,(ConfidentialAssetId *)in_stack_fffffffffffffbc8,
               in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbf0,
               (Pubkey *)in_stack_fffffffffffffbf8,(Privkey *)in_stack_fffffffffffffc00,
               (string *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc18,in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference
              ((ConfidentialTxOutReference *)this_00);
    core::Address::~Address(this_00);
  }
  core::ConfidentialTxOut::GetConfidentialValue(&local_578,in_stack_00000010);
  AVar2 = core::ConfidentialValue::GetAmount(&local_578);
  local_588 = AVar2.amount_;
  local_580 = AVar2.ignore_check_;
  local_550.amount_ = local_588;
  local_550.ignore_check_ = (bool)local_580;
  bVar1 = core::Amount::operator!=(&local_550,0);
  core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x590928);
  if (bVar1) {
    core::ConfidentialTxOut::GetConfidentialValue(&local_6b8,in_stack_00000010);
    AVar2 = core::ConfidentialValue::GetAmount(&local_6b8);
    local_6c8 = AVar2.amount_;
    local_6c0 = AVar2.ignore_check_;
    local_690 = local_6c8;
    local_688 = local_6c0;
    core::ConfidentialTxOut::GetAsset(&local_6f0,in_stack_00000010);
    ConfidentialTransactionController::AddTxOutFee
              ((ConfidentialTransactionController *)CONCAT44(in_stack_fffffffffffff87c,uVar4),value,
               (ConfidentialAssetId *)CONCAT44(in_stack_fffffffffffff86c,uVar3));
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference
              ((ConfidentialTxOutReference *)this_00);
    core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x5909f2);
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5909ff);
  }
  local_141 = 1;
  core::ConfidentialTxOut::~ConfidentialTxOut(&local_140);
  return (ConfidentialTransactionController *)in_RDI;
}

Assistant:

ConfidentialTransactionController
ElementsTransactionApi::CreateRawPegoutTransaction(
    uint32_t version, uint32_t locktime,
    const std::vector<ConfidentialTxIn>& txins,
    const std::vector<ConfidentialTxOut>& txouts,
    const TxOutPegoutParameters& pegout_data,
    const ConfidentialTxOut& txout_fee, Address* pegout_address) const {
  ConfidentialTxOut empty_fee;
  ConfidentialTransactionController ctxc =
      CreateRawTransaction(version, locktime, txins, txouts, empty_fee);

  if (pegout_data.online_pubkey.IsValid() &&
      !pegout_data.master_online_key.IsInvalid()) {
    Address dummy_addr;
    ctxc.AddPegoutTxOut(
        pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
        dummy_addr, pegout_data.net_type, pegout_data.online_pubkey,
        pegout_data.master_online_key, pegout_data.bitcoin_descriptor,
        pegout_data.bip32_counter, pegout_data.whitelist,
        pegout_data.elements_net_type, pegout_address);
  } else {
    ctxc.AddPegoutTxOut(
        pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
        pegout_data.btc_address);
  }

  // A fee with an amount of 0 is considered invalid.
  if (txout_fee.GetConfidentialValue().GetAmount() != 0) {
    ctxc.AddTxOutFee(
        txout_fee.GetConfidentialValue().GetAmount(), txout_fee.GetAsset());
  }

  return ctxc;
}